

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O3

void WriteTableIntoFile(FILE *pFile)

{
  varvalue vVar1;
  uint uVar2;
  Cube *pC;
  int iVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  
  pC = IterCubeSetStart();
  do {
    if (pC == (Cube *)0x0) {
      return;
    }
    if (pC->fMark != '\0') {
      __assert_fail("p->fMark == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorUtil.c"
                    ,0x92,"void WriteTableIntoFile(FILE *)");
    }
    if (0 < g_CoverInfo.nVarsIn) {
      iVar3 = 0;
      do {
        vVar1 = GetVar(pC,iVar3);
        if (2 < vVar1 - VAR_NEG) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorUtil.c"
                        ,0x9f,"void WriteTableIntoFile(FILE *)");
        }
        fputc(*(int *)(&DAT_0096c324 + (ulong)(vVar1 - VAR_NEG) * 4),(FILE *)pFile);
        iVar3 = iVar3 + 1;
      } while (iVar3 < g_CoverInfo.nVarsIn);
    }
    fputc(0x20,(FILE *)pFile);
    if (0 < g_CoverInfo.nWordsOut) {
      iVar3 = 1 - g_CoverInfo.nVarsOut;
      lVar4 = 0;
      iVar5 = 0;
      do {
        uVar6 = 0;
        do {
          fputc(((pC->pCubeDataOut[lVar4] >> (uVar6 & 0x1f) & 1) != 0) + 0x30,(FILE *)pFile);
          uVar2 = uVar6 + 1;
          if (iVar3 + iVar5 + uVar6 == 0) break;
          bVar7 = uVar6 < 0x1f;
          uVar6 = uVar2;
        } while (bVar7);
        lVar4 = lVar4 + 1;
        iVar5 = iVar5 + uVar2;
      } while (lVar4 < g_CoverInfo.nWordsOut);
    }
    fputc(10,(FILE *)pFile);
    pC = IterCubeSetNext();
  } while( true );
}

Assistant:

void WriteTableIntoFile( FILE * pFile )
// nCubesAlloc is the number of allocated cubes 
{
    int v, w;
    Cube * p;
    int cOutputs;
    int nOutput;
    int WordSize;

    for ( p = IterCubeSetStart( ); p; p = IterCubeSetNext() )
    {
        assert( p->fMark == 0 );

        // write the input variables
        for ( v = 0; v < g_CoverInfo.nVarsIn; v++ )
        {
            int Value = GetVar( p, v );
            if ( Value == VAR_NEG )
                fprintf( pFile, "0" );
            else if ( Value == VAR_POS )
                fprintf( pFile, "1" );
            else if ( Value == VAR_ABS )
                fprintf( pFile, "-" );
            else
                assert(0);
        }
        fprintf( pFile, " " );

        // write the output variables
        cOutputs = 0;
        nOutput = g_CoverInfo.nVarsOut;
        WordSize = 8*sizeof( unsigned );
        for ( w = 0; w < g_CoverInfo.nWordsOut; w++ )
            for ( v = 0; v < WordSize; v++ )
            {
                if ( p->pCubeDataOut[w] & (1<<v) )
                    fprintf( pFile, "1" );
                else
                    fprintf( pFile, "0" );
                if ( ++cOutputs == nOutput )
                    break;
            }
        fprintf( pFile, "\n" );
    }
}